

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vq.c
# Opt level: O0

float prune_distance(float *x,float *y,int Ndim,float mindist)

{
  float local_28;
  float t;
  float dist;
  int i;
  float mindist_local;
  int Ndim_local;
  float *y_local;
  float *x_local;
  
  local_28 = (*x - *y) * (*x - *y);
  t = 1.4013e-45;
  _mindist_local = y + 1;
  y_local = x + 1;
  while( true ) {
    if (Ndim <= (int)t) {
      return local_28;
    }
    local_28 = (*y_local - *_mindist_local) * (*y_local - *_mindist_local) + local_28;
    if (mindist < local_28) break;
    t = (float)((int)t + 1);
    _mindist_local = _mindist_local + 1;
    y_local = y_local + 1;
  }
  return local_28;
}

Assistant:

float prune_distance(float *x, float *y, int Ndim, float mindist)
{
	auto int i;
	auto float dist, t;

	t = *x++ - *y++;
	dist = t * t;
	for (i = 1; i < Ndim; ++i) {
		t = *x++ - *y++;
		dist += t * t;
		if (dist > mindist)
			break;
	}
	return (dist);
}